

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int ltf8_put(char *cp,int64_t val)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  int64_t val_local;
  char *cp_local;
  
  cVar1 = (char)val;
  if ((val & 0xffffffffffffff80U) == 0) {
    *cp = cVar1;
    cp_local._4_4_ = 1;
  }
  else {
    bVar2 = (byte)((ulong)val >> 8);
    if ((val & 0xffffffffffffc000U) == 0) {
      *cp = bVar2 | 0x80;
      cp[1] = cVar1;
      cp_local._4_4_ = 2;
    }
    else {
      bVar3 = (byte)((ulong)val >> 0x10);
      if ((val & 0xffffffffffe00000U) == 0) {
        *cp = bVar3 | 0xc0;
        cp[1] = bVar2;
        cp[2] = cVar1;
        cp_local._4_4_ = 3;
      }
      else {
        bVar4 = (byte)((ulong)val >> 0x18);
        if ((val & 0xfffffffff0000000U) == 0) {
          *cp = bVar4 | 0xe0;
          cp[1] = bVar3;
          cp[2] = bVar2;
          cp[3] = cVar1;
          cp_local._4_4_ = 4;
        }
        else {
          bVar5 = (byte)((ulong)val >> 0x20);
          if ((val & 0xfffffff800000000U) == 0) {
            *cp = bVar5 | 0xf0;
            cp[1] = bVar4;
            cp[2] = bVar3;
            cp[3] = bVar2;
            cp[4] = cVar1;
            cp_local._4_4_ = 5;
          }
          else {
            bVar6 = (byte)((ulong)val >> 0x28);
            if ((val & 0xfffffc0000000000U) == 0) {
              *cp = bVar6 | 0xf8;
              cp[1] = bVar5;
              cp[2] = bVar4;
              cp[3] = bVar3;
              cp[4] = bVar2;
              cp[5] = cVar1;
              cp_local._4_4_ = 6;
            }
            else {
              bVar7 = (byte)((ulong)val >> 0x30);
              if ((val & 0xfffe000000000000U) == 0) {
                *cp = bVar7 | 0xfc;
                cp[1] = bVar6;
                cp[2] = bVar5;
                cp[3] = bVar4;
                cp[4] = bVar3;
                cp[5] = bVar2;
                cp[6] = cVar1;
                cp_local._4_4_ = 7;
              }
              else {
                bVar8 = (byte)((ulong)val >> 0x38);
                if ((val & 0xff00000000000000U) == 0) {
                  *cp = bVar8 | 0xfe;
                  cp[1] = bVar7;
                  cp[2] = bVar6;
                  cp[3] = bVar5;
                  cp[4] = bVar4;
                  cp[5] = bVar3;
                  cp[6] = bVar2;
                  cp[7] = cVar1;
                  cp_local._4_4_ = 8;
                }
                else {
                  *cp = -1;
                  cp[1] = bVar8;
                  cp[2] = bVar7;
                  cp[3] = bVar6;
                  cp[4] = bVar5;
                  cp[5] = bVar4;
                  cp[6] = bVar3;
                  cp[7] = bVar2;
                  cp[8] = cVar1;
                  cp_local._4_4_ = 9;
                }
              }
            }
          }
        }
      }
    }
  }
  return cp_local._4_4_;
}

Assistant:

int ltf8_put(char *cp, int64_t val) {
    if        (!(val & ~((1LL<<7)-1))) {
	*cp = val;
	return 1;
    } else if (!(val & ~((1LL<<(6+8))-1))) {
	*cp++ = (val >> 8 ) | 0x80;
	*cp   = val & 0xff;
	return 2;
    } else if (!(val & ~((1LL<<(5+2*8))-1))) {
	*cp++ = (val >> 16) | 0xc0;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 3;
    } else if (!(val & ~((1LL<<(4+3*8))-1))) {
	*cp++ = (val >> 24) | 0xe0;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 4;
    } else if (!(val & ~((1LL<<(3+4*8))-1))) {
	*cp++ = (val >> 32) | 0xf0;
	*cp++ = (val >> 24) & 0xff;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 5;
    } else if (!(val & ~((1LL<<(2+5*8))-1))) {
	*cp++ = (val >> 40) | 0xf8;
	*cp++ = (val >> 32) & 0xff;
	*cp++ = (val >> 24) & 0xff;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 6;
    } else if (!(val & ~((1LL<<(1+6*8))-1))) {
	*cp++ = (val >> 48) | 0xfc;
	*cp++ = (val >> 40) & 0xff;
	*cp++ = (val >> 32) & 0xff;
	*cp++ = (val >> 24) & 0xff;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 7;
    } else if (!(val & ~((1LL<<(7*8))-1))) {
	*cp++ = (val >> 56) | 0xfe;
	*cp++ = (val >> 48) & 0xff;
	*cp++ = (val >> 40) & 0xff;
	*cp++ = (val >> 32) & 0xff;
	*cp++ = (val >> 24) & 0xff;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 8;
    } else {
	*cp++ = 0xff;
	*cp++ = (val >> 56) & 0xff;
	*cp++ = (val >> 48) & 0xff;
	*cp++ = (val >> 40) & 0xff;
	*cp++ = (val >> 32) & 0xff;
	*cp++ = (val >> 24) & 0xff;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 9;
    }
}